

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

void __thiscall sentencepiece::SentencePieceText::Clear(SentencePieceText *this)

{
  InternalMetadata *this_00;
  uint32 cached_has_bits;
  SentencePieceText *this_local;
  
  google::protobuf::internal::ExtensionSet::Clear(&this->_extensions_);
  google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::Clear
            (&this->pieces_);
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty(&this->text_);
  }
  this->score_ = 0.0;
  memset(&this->_has_bits_,0,4);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if (((uint)this_00->ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(this_00);
  }
  return;
}

Assistant:

void SentencePieceText::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  pieces_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    text_.ClearNonDefaultToEmpty();
  }
  score_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}